

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_regex.cpp
# Opt level: O1

bool match(string *r,string *t,int flags)

{
  char *pcVar1;
  char cVar2;
  char cVar3;
  ostream *poVar4;
  runtime_error *this;
  regex re;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> m;
  ostringstream oss;
  regex local_1d0 [8];
  void *local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  string local_1b0 [32];
  ostringstream local_190 [376];
  
  booster::regex::regex(local_1d0,(string *)r,flags);
  local_1c8 = (void *)0x0;
  uStack_1c0 = 0;
  local_1b8 = 0;
  pcVar1 = (t->_M_dataplus)._M_p;
  cVar2 = booster::regex::match((char *)local_1d0,pcVar1,(int)t->_M_string_length + (int)pcVar1);
  pcVar1 = (t->_M_dataplus)._M_p;
  cVar3 = booster::regex::match
                    ((char *)local_1d0,pcVar1,(vector *)(pcVar1 + t->_M_string_length),
                     (int)&local_1c8);
  if (cVar2 == cVar3) {
    if (local_1c8 != (void *)0x0) {
      operator_delete(local_1c8);
    }
    booster::regex::~regex(local_1d0);
    return (bool)cVar2;
  }
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Error ",6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/booster/lib/regex/test/test_regex.cpp"
             ,0x6e);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,":",1);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)local_190,0x27);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," v1==v2",7);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this,local_1b0);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool match(std::string r,std::string t,int flags = 0)
{
	booster::regex re(r,flags);
	std::vector<std::pair<int,int> > m;
	bool v1 = re.match(t.c_str(),t.c_str()+t.size());
	bool v2 = re.match(t.c_str(),t.c_str()+t.size(),m);
	TEST(v1==v2);
	return v1;
}